

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall yactfr::internal::JsonBioValReq::JsonBioValReq(JsonBioValReq *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_af;
  undefined1 local_ae;
  allocator local_ad [20];
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  iterator local_50;
  size_type local_48;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  JsonBioValReq *local_10;
  JsonBioValReq *this_local;
  
  local_ae = 1;
  local_98 = &local_90;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"first-to-last",&local_99);
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"last-to-first",local_ad);
  local_ae = 0;
  local_50 = &local_90;
  local_48 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_b0);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_40,__l,&local_af,&local_b0);
  JsonScalarValInSetReq<yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>,_(yactfr::internal::JsonValKind)5>
  ::JsonScalarValInSetReq(&this->super_JsonStrValInSetReq,&local_40);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_40);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_b0);
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
  do {
    local_f8 = local_f8 + -1;
    std::__cxx11::string::~string((string *)local_f8);
  } while (local_f8 != &local_90);
  std::allocator<char>::~allocator((allocator<char> *)local_ad);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  (this->super_JsonStrValInSetReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonBioValReq_007df3b8;
  return;
}

Assistant:

explicit JsonBioValReq() :
        JsonStrValInSetReq {JsonStrValInSetReq::Set {strs::ftl, strs::ltf}}
    {
    }